

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::Detail::Approx::setMargin(Approx *this,double newMargin)

{
  string local_40;
  ReusableStringStream local_20;
  
  if (0.0 <= newMargin) {
    this->m_margin = newMargin;
    return;
  }
  ReusableStringStream::ReusableStringStream(&local_20);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_20.m_oss,"Invalid Approx::margin: ",0x18);
  std::ostream::_M_insert<double>(newMargin);
  local_40._M_dataplus._M_p._0_1_ = 0x2e;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_20.m_oss,(char *)&local_40,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_20.m_oss," Approx::Margin has to be non-negative.",0x27);
  std::__cxx11::stringbuf::str();
  throw_domain_error(&local_40);
}

Assistant:

void Approx::setMargin(double newMargin) {
        CATCH_ENFORCE(newMargin >= 0,
            "Invalid Approx::margin: " << newMargin << '.'
            << " Approx::Margin has to be non-negative.");
        m_margin = newMargin;
    }